

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

string * GetDescriptorChecksum(string *__return_storage_ptr__,string *descriptor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long in_FS_OFFSET;
  Span<const_char> sp;
  string error;
  string ret;
  allocator<char> local_69;
  Span<const_char> local_68;
  string local_58;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_38.field_2;
  local_38._M_string_length = 0;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_58.field_2._M_local_buf[0] = '\0';
  local_68.m_data = (descriptor->_M_dataplus)._M_p;
  local_68.m_size = descriptor->_M_string_length;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = CheckChecksum(&local_68,false,&local_58,&local_38);
  if (bVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,local_38.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_38.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_38._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,local_38.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_38._M_string_length;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_38._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_69);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string GetDescriptorChecksum(const std::string& descriptor)
{
    std::string ret;
    std::string error;
    Span<const char> sp{descriptor};
    if (!CheckChecksum(sp, false, error, &ret)) return "";
    return ret;
}